

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O2

void __thiscall MDIOAnalyzer::AddArrowMarkers(MDIOAnalyzer *this)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    puVar1 = (this->mMdcPosedgeArrows).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->mMdcPosedgeArrows).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)puVar2 - (long)puVar1 >> 3) <= (ulong)uVar3) break;
    AnalyzerResults::AddMarker
              ((ulonglong)(this->mResults)._M_ptr,(MarkerType)puVar1[uVar3],(Channel *)0x4);
    uVar3 = uVar3 + 1;
  }
  if (puVar2 != puVar1) {
    (this->mMdcPosedgeArrows).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  uVar3 = 0;
  while( true ) {
    puVar1 = (this->mMdcNegedgeArrows).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->mMdcNegedgeArrows).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)puVar2 - (long)puVar1 >> 3) <= (ulong)uVar3) break;
    AnalyzerResults::AddMarker
              ((ulonglong)(this->mResults)._M_ptr,(MarkerType)puVar1[uVar3],(Channel *)0x5);
    uVar3 = uVar3 + 1;
  }
  if (puVar2 != puVar1) {
    (this->mMdcNegedgeArrows).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void MDIOAnalyzer::AddArrowMarkers()
{
    // add arrows in clock posedges
    for( U32 i = 0; i < mMdcPosedgeArrows.size(); i++ )
    {
        mResults->AddMarker( mMdcPosedgeArrows[ i ], AnalyzerResults::UpArrow, mSettings->mMdcChannel );
    }
    mMdcPosedgeArrows.clear();

    // add arrows in clock negedges
    for( U32 i = 0; i < mMdcNegedgeArrows.size(); i++ )
    {
        mResults->AddMarker( mMdcNegedgeArrows[ i ], AnalyzerResults::DownArrow, mSettings->mMdcChannel );
    }
    mMdcNegedgeArrows.clear();
}